

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

void __thiscall
LowererMDArch::EmitLoadVar(LowererMDArch *this,Instr *instrLoad,bool isFromUint32,bool isHelper)

{
  RegOpnd *src;
  LowererMD *pLVar1;
  Func *pFVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  undefined4 *puVar8;
  RegOpnd *this_00;
  Opnd *this_01;
  Instr *pIVar9;
  IntConstOpnd *this_02;
  LabelInstr *branchTarget;
  LabelInstr *branchTarget_00;
  BranchInstr *pBVar10;
  RegOpnd *local_40;
  
  OVar4 = IR::Opnd::GetKind(instrLoad->m_src1);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x9d2,"(instrLoad->GetSrc1()->IsRegOpnd())",
                       "instrLoad->GetSrc1()->IsRegOpnd()");
    if (!bVar5) goto LAB_0064872c;
    *puVar8 = 0;
  }
  local_40 = (RegOpnd *)instrLoad->m_dst;
  if ((local_40->super_Opnd).m_type != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x9d3,"(instrLoad->GetDst()->GetType() == TyVar)",
                       "instrLoad->GetDst()->GetType() == TyVar");
    if (!bVar5) goto LAB_0064872c;
    *puVar8 = 0;
    local_40 = (RegOpnd *)instrLoad->m_dst;
  }
  src = (RegOpnd *)instrLoad->m_src1;
  OVar4 = IR::Opnd::GetKind((Opnd *)src);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_0064872c;
    *puVar8 = 0;
  }
  (src->super_Opnd).m_type = TyInt32;
  bVar5 = IR::Opnd::IsTaggedInt((Opnd *)src);
  if (!bVar5) {
    bVar6 = IR::Opnd::IsNotInt((Opnd *)src);
    if (bVar6) {
      pLVar1 = this->lowererMD;
      OVar4 = IR::Opnd::GetKind(&local_40->super_Opnd);
      if (OVar4 == OpndKindReg) {
LAB_00648293:
        LowererMD::EmitLoadVarNoCheck(pLVar1,local_40,src,instrLoad,isFromUint32,isHelper);
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (bVar5) {
        *puVar8 = 0;
        goto LAB_00648293;
      }
      goto LAB_0064872c;
    }
  }
  this_00 = IR::RegOpnd::New(TyVar,this->m_func);
  this_01 = IR::Opnd::Copy(&this_00->super_Opnd,this->m_func);
  OVar4 = IR::Opnd::GetKind(this_01);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_0064872c;
    *puVar8 = 0;
  }
  this_01->m_type = TyInt32;
  pIVar9 = IR::Instr::New(MOV_TRUNC,this_01,(Opnd *)src,this->m_func);
  IR::Instr::InsertBefore(instrLoad,pIVar9);
  if (!bVar5 && isFromUint32) {
    pIVar9 = IR::Instr::New(CMP,this->m_func);
    if (pIVar9->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_0064872c;
      *puVar8 = 0;
    }
    pFVar2 = pIVar9->m_func;
    if (this_01->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_0064872c;
      *puVar8 = 0;
    }
    bVar7 = this_01->field_0xb;
    if ((bVar7 & 2) != 0) {
      this_01 = IR::Opnd::Copy(this_01,pFVar2);
      bVar7 = this_01->field_0xb;
    }
    this_01->field_0xb = bVar7 | 2;
    pIVar9->m_src1 = this_01;
    this_02 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    if (pIVar9->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_0064872c;
      *puVar8 = 0;
    }
    pFVar2 = pIVar9->m_func;
    if ((this_02->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_0064872c;
      *puVar8 = 0;
    }
    bVar7 = (this_02->super_Opnd).field_0xb;
    if ((bVar7 & 2) != 0) {
      this_02 = (IntConstOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,pFVar2);
      bVar7 = (this_02->super_Opnd).field_0xb;
    }
    (this_02->super_Opnd).field_0xb = bVar7 | 2;
    pIVar9->m_src2 = &this_02->super_Opnd;
    IR::Instr::InsertBefore(instrLoad,pIVar9);
    branchTarget = IR::LabelInstr::New(Label,this->m_func,true);
    pBVar10 = IR::BranchInstr::New(JLT,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrLoad,&pBVar10->super_Instr);
  }
  else {
    branchTarget = (LabelInstr *)0x0;
  }
  LowererMD::GenerateInt32ToVarConversion(this->lowererMD,&this_00->super_Opnd,instrLoad);
  pIVar9 = IR::Instr::New(MOV,&local_40->super_Opnd,&this_00->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrLoad,pIVar9);
  if (branchTarget != (LabelInstr *)0x0) {
    if (!isFromUint32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0xa12,"(isFromUint32)","isFromUint32");
      if (!bVar5) goto LAB_0064872c;
      *puVar8 = 0;
    }
    branchTarget_00 = IR::LabelInstr::New(Label,this->m_func,isHelper);
    pBVar10 = IR::BranchInstr::New(JMP,branchTarget_00,this->m_func);
    IR::Instr::InsertBefore(instrLoad,&pBVar10->super_Instr);
    IR::Instr::InsertBefore(instrLoad,&branchTarget->super_Instr);
    pLVar1 = this->lowererMD;
    OVar4 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) {
LAB_0064872c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    LowererMD::EmitLoadVarNoCheck(pLVar1,local_40,src,instrLoad,isFromUint32,true);
    IR::Instr::InsertBefore(instrLoad,&branchTarget_00->super_Instr);
  }
  IR::Instr::Remove(instrLoad);
  return;
}

Assistant:

void
LowererMDArch::EmitLoadVar(IR::Instr *instrLoad, bool isFromUint32, bool isHelper)
{
    //    MOV_TRUNC e1, e_src1
    //    CMP e1, 0             [uint32]
    //    JLT $Helper           [uint32]  -- overflows?
    //    BTS r1, VarTag_Shift
    //    MOV r_dst, r1
    //    JMP $done             [uint32]
    // $helper                  [uint32]
    //    EmitLoadVarNoCheck
    // $done                    [uint32]


    Assert(instrLoad->GetSrc1()->IsRegOpnd());
    Assert(instrLoad->GetDst()->GetType() == TyVar);

    bool isInt            = false;
    IR::Opnd *dst         = instrLoad->GetDst();
    IR::RegOpnd *src1     = instrLoad->GetSrc1()->AsRegOpnd();
    IR::LabelInstr *labelHelper = nullptr;

    // TODO: Fix bad lowering. We shouldn't get TyVars here.
    // Assert(instrLoad->GetSrc1()->GetType() == TyInt32);
    src1->SetType(TyInt32);

    if (src1->IsTaggedInt())
    {
        isInt = true;
    }
    else if (src1->IsNotInt())
    {
        // ToVar()
        this->lowererMD->EmitLoadVarNoCheck(dst->AsRegOpnd(), src1, instrLoad, isFromUint32, isHelper);
        return;
    }

    IR::RegOpnd *r1 = IR::RegOpnd::New(TyVar, m_func);

    // e1 = MOV_TRUNC e_src1
    // (Use MOV_TRUNC here as we rely on the register copy to clear the upper 32 bits.)
    IR::RegOpnd *e1 = r1->Copy(m_func)->AsRegOpnd();
    e1->SetType(TyInt32);
    instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC,
        e1,
        src1,
        m_func));

    if (!isInt && isFromUint32)
    {
        // CMP e1, 0
        IR::Instr *instr = IR::Instr::New(Js::OpCode::CMP, m_func);
        instr->SetSrc1(e1);
        instr->SetSrc2(IR::IntConstOpnd::New(0, TyInt32, m_func));
        instrLoad->InsertBefore(instr);

        Assert(!labelHelper);
        labelHelper = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);

        // JLT $helper
        instr = IR::BranchInstr::New(Js::OpCode::JLT, labelHelper, m_func);
        instrLoad->InsertBefore(instr);
    }

    // The previous operation clears the top 32 bits.
    // BTS r1, VarTag_Shift
    this->lowererMD->GenerateInt32ToVarConversion(r1, instrLoad);

    // REVIEW: We need r1 only if we could generate sn = Ld_A_I4 sn. i.e. the destination and
    // source are the same.
    // r_dst = MOV r1
    instrLoad->InsertBefore(IR::Instr::New(Js::OpCode::MOV,
        dst,
        r1,
        m_func));

    if (labelHelper)
    {
        Assert(isFromUint32);

        // JMP $done
        IR::LabelInstr * labelDone = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
        instrLoad->InsertBefore(IR::BranchInstr::New(Js::OpCode::JMP, labelDone, m_func));

        // $helper
        instrLoad->InsertBefore(labelHelper);

        // ToVar()
        this->lowererMD->EmitLoadVarNoCheck(dst->AsRegOpnd(), src1, instrLoad, isFromUint32, true);

        // $done
        instrLoad->InsertBefore(labelDone);
    }
    instrLoad->Remove();
}